

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddConstraint
          (DuckTableEntry *this,ClientContext *context,AddConstraintInfo *info)

{
  __node_base_ptr p_Var1;
  Catalog *args;
  SchemaCatalogEntry *args_1;
  pointer pCVar2;
  pointer pCVar3;
  UniqueConstraint *pUVar4;
  Binder *pBVar5;
  string *table;
  type args_2;
  type args_2_00;
  InternalException *this_00;
  Constraint *pCVar6;
  CatalogException *this_01;
  long in_RCX;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *constraint;
  __node_base_ptr this_02;
  pointer *__ptr;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_03;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_148;
  optional_ptr<duckdb::Constraint,_true> existing_pk;
  undefined1 local_138 [8];
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  undefined1 local_108 [8];
  shared_ptr<duckdb::DataTable,_true> new_storage;
  shared_ptr<duckdb::Binder,_true> binder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
            ((duckdb *)&local_148,
             *(SchemaCatalogEntry **)&(context->config).query_verification_enabled,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &context->interrupted);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_148);
  Value::operator=(&(pCVar2->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  ColumnList::Copy((ColumnList *)&binder,(ColumnList *)&(context->config).asof_loop_join_threshold);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_148);
  ColumnList::operator=(&pCVar2->columns,(ColumnList *)&binder);
  ColumnList::~ColumnList((ColumnList *)&binder);
  p_Var1 = (context->config).set_variables._M_h._M_single_bucket;
  for (this_02 = (__node_base_ptr)
                 (context->config).set_variables._M_h._M_rehash_policy._M_next_resize;
      this_02 != p_Var1; this_02 = this_02 + 1) {
    pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_148);
    pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                         *)this_02);
    (*pCVar3->_vptr_Constraint[3])((ColumnList *)&binder,pCVar3);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar2->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &binder);
    if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(code *)((((binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
  }
  this_03 = (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
            (in_RCX + 0x78);
  pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator->
                     (this_03);
  if (pCVar3->type == UNIQUE) {
    pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_03);
    pUVar4 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar3);
    existing_pk = TableCatalogEntry::GetPrimaryKey((TableCatalogEntry *)context);
    if ((existing_pk.ptr != (Constraint *)0x0) && (pUVar4->is_primary_key != false)) {
      pCVar6 = optional_ptr<duckdb::Constraint,_true>::operator->(&existing_pk);
      (*pCVar6->_vptr_Constraint[2])(&binder,pCVar6);
      this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&new_storage,"table \"%s\" can have only one primary key: %s",
                 (allocator *)&bound_create_info);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&context->interrupted);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&binder);
      CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                (this_01,(string *)&new_storage,&local_50,&local_70);
      __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_148);
    pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_03);
    (*pCVar3->_vptr_Constraint[3])(&binder,pCVar3);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar2->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &binder);
    if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(code *)((((binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    Binder::CreateBinder
              ((Binder *)&binder,(ClientContext *)info,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
    pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
    table = (string *)
            unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator*
                      (this_03);
    pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_148);
    unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
    operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                *)&local_148);
    Binder::BindConstraint
              ((Binder *)&existing_pk,(Constraint *)pBVar5,table,(ColumnList *)&pCVar2->table);
    pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
    local_138 = (undefined1  [8])local_148._M_head_impl;
    local_148._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)&bound_create_info,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               pBVar5,(SchemaCatalogEntry *)local_138);
    if (local_138 != (undefined1  [8])0x0) {
      (*(((CreateInfo *)local_138)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_138 = (undefined1  [8])0x0;
    args_2 = shared_ptr<duckdb::DataTable,_true>::operator*
                       ((shared_ptr<duckdb::DataTable,_true> *)
                        &(context->config).user_variables._M_h._M_bucket_count);
    unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>::
    operator*((unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               *)&existing_pk);
    make_shared_ptr<duckdb::DataTable,duckdb::ClientContext&,duckdb::DataTable&,duckdb::BoundConstraint&>
              ((ClientContext *)&new_storage,(DataTable *)info,(BoundConstraint *)args_2);
    args = (Catalog *)(context->config).max_expression_depth;
    args_1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    args_2_00 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*(&bound_create_info);
    make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
              ((duckdb *)local_108,args,args_1,args_2_00,&new_storage);
    (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)local_108;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_storage.internal.
                super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr(&bound_create_info.
                 super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               );
    if (existing_pk.ptr != (Constraint *)0x0) {
      (*(existing_pk.ptr)->_vptr_Constraint[1])();
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_148._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_148._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&binder,"unsupported constraint type in ALTER TABLE statement",
             (allocator *)&new_storage);
  InternalException::InternalException(this_00,(string *)&binder);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddConstraint(ClientContext &context, AddConstraintInfo &info) {
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->comment = comment;

	// Copy all columns and constraints to the modified table.
	create_info->columns = columns.Copy();
	for (const auto &constraint : constraints) {
		create_info->constraints.push_back(constraint->Copy());
	}

	if (info.constraint->type == ConstraintType::UNIQUE) {
		const auto &unique = info.constraint->Cast<UniqueConstraint>();
		const auto existing_pk = GetPrimaryKey();

		if (unique.is_primary_key && existing_pk) {
			auto existing_name = existing_pk->ToString();
			throw CatalogException("table \"%s\" can have only one primary key: %s", name, existing_name);
		}
		create_info->constraints.push_back(info.constraint->Copy());

	} else {
		throw InternalException("unsupported constraint type in ALTER TABLE statement");
	}

	// We create a physical table with a new constraint and a new unique index.
	const auto binder = Binder::CreateBinder(context);
	const auto bound_constraint = binder->BindConstraint(*info.constraint, create_info->table, create_info->columns);
	const auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);

	auto new_storage = make_shared_ptr<DataTable>(context, *storage, *bound_constraint);
	auto new_entry = make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
	return std::move(new_entry);
}